

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_cat(lua_State *L,TValue *top,int left)

{
  uint64_t uVar1;
  bool bVar2;
  cTValue *pcVar3;
  SBuf *sb_00;
  ulong uVar4;
  GCstr *pGVar5;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  SBufExt *sbx;
  MSize len;
  GCstr *s;
  SBuf *sb;
  uint64_t tlen;
  TValue *o;
  TValue *e;
  cTValue *mo;
  int fromc;
  int left_local;
  TValue *top_local;
  lua_State *L_local;
  SBuf *sb_1;
  
  mo._4_4_ = left;
  _fromc = top;
  if (left < 0) {
    mo._4_4_ = -left;
  }
  while( true ) {
    if (((((int)(_fromc->field_4).it >> 0xf != -5) &&
         (0xfffffff2 < (uint)((int)(_fromc->field_4).it >> 0xf))) &&
        (((int)(_fromc->field_4).it >> 0xf != -0xd ||
         (*(char *)((_fromc->u64 & 0x7fffffffffff) + 10) != '\x03')))) ||
       ((((int)_fromc[-1].field_4.it >> 0xf != -5 &&
         (0xfffffff2 < (uint)((int)_fromc[-1].field_4.it >> 0xf))) &&
        (((int)_fromc[-1].field_4.it >> 0xf != -0xd ||
         (*(char *)((_fromc[-1].u64 & 0x7fffffffffff) + 10) != '\x03')))))) {
      e = lj_meta_lookup(L,_fromc + -1,MM_concat);
      if ((e->u64 == 0xffffffffffffffff) &&
         (e = lj_meta_lookup(L,_fromc,MM_concat), e->u64 == 0xffffffffffffffff)) {
        if (((int)_fromc[-1].field_4.it >> 0xf == -5) ||
           ((uint)((int)_fromc[-1].field_4.it >> 0xf) < 0xfffffff3)) {
          _fromc = _fromc + 1;
        }
        lj_err_optype(L,_fromc + -1,LJ_ERR_OPCAT);
      }
      _fromc[4] = (cTValue)*(anon_struct_8_2_7fa0a05d_for_TValue_4 *)_fromc;
      _fromc[3] = _fromc[-1];
      _fromc[1] = *e;
      _fromc[-1].n = (lua_Number)lj_cont_cat;
      _fromc->u64 = 0xffffffffffffffff;
      _fromc[2].u64 = 0xffffffffffffffff;
      return _fromc + 3;
    }
    tlen = (uint64_t)_fromc;
    if ((int)(_fromc->field_4).it >> 0xf == -5) {
      local_1a4 = *(uint *)((_fromc->u64 & 0x7fffffffffff) + 0x14);
    }
    else {
      if (((int)(_fromc->field_4).it >> 0xf == -0xd) &&
         (*(char *)((_fromc->u64 & 0x7fffffffffff) + 10) == '\x03')) {
        local_1a8 = (int)*(undefined8 *)((_fromc->u64 & 0x7fffffffffff) + 0x30) -
                    (int)*(undefined8 *)((_fromc->u64 & 0x7fffffffffff) + 0x58);
      }
      else {
        local_1a8 = 0x20;
      }
      local_1a4 = local_1a8;
    }
    sb = (SBuf *)(ulong)local_1a4;
    do {
      pcVar3 = (cTValue *)(tlen - 8);
      if ((int)(pcVar3->field_4).it >> 0xf == -5) {
        local_1ac = *(uint *)((pcVar3->u64 & 0x7fffffffffff) + 0x14);
      }
      else {
        if (((int)(pcVar3->field_4).it >> 0xf == -0xd) &&
           (*(char *)((pcVar3->u64 & 0x7fffffffffff) + 10) == '\x03')) {
          local_1b0 = (int)*(undefined8 *)((pcVar3->u64 & 0x7fffffffffff) + 0x30) -
                      (int)*(undefined8 *)((pcVar3->u64 & 0x7fffffffffff) + 0x58);
        }
        else {
          local_1b0 = 0x20;
        }
        local_1ac = local_1b0;
      }
      sb = (SBuf *)((long)&sb->w + (ulong)local_1ac);
      mo._4_4_ = mo._4_4_ + -1;
      bVar2 = false;
      if ((0 < mo._4_4_) && (bVar2 = true, (int)((long)*(undefined8 *)(tlen - 0x10) >> 0x2f) != -5))
      {
        bVar2 = (uint)((long)*(undefined8 *)(tlen - 0x10) >> 0x2f) < 0xfffffff3;
      }
      tlen = (uint64_t)pcVar3;
    } while (bVar2);
    if ((SBuf *)0x7ffffeff < sb) break;
    uVar1 = (L->glref).ptr64;
    sb_00 = (SBuf *)(uVar1 + 200);
    *(lua_State **)(uVar1 + 0xe0) = L;
    sb_00->w = *(char **)(uVar1 + 0xd8);
    if ((uint)((int)*(undefined8 *)(uVar1 + 0xd0) - (int)sb_00->w) < (uint)sb) {
      lj_buf_more2(sb_00,(uint)sb);
    }
    for (; tlen <= _fromc; tlen = tlen + 8) {
      if ((int)((long)*(undefined8 *)tlen >> 0x2f) == -5) {
        lj_buf_putmem(sb_00,(void *)((*(ulong *)tlen & 0x7fffffffffff) + 0x18),
                      *(MSize *)((*(ulong *)tlen & 0x7fffffffffff) + 0x14));
      }
      else if (((int)((long)*(undefined8 *)tlen >> 0x2f) == -0xd) &&
              (*(char *)((*(ulong *)tlen & 0x7fffffffffff) + 10) == '\x03')) {
        uVar4 = *(ulong *)tlen & 0x7fffffffffff;
        lj_buf_putmem(sb_00,*(void **)(uVar4 + 0x58),
                      (int)*(undefined8 *)(uVar4 + 0x30) - (int)*(undefined8 *)(uVar4 + 0x58));
      }
      else {
        lj_strfmt_putfnum(sb_00,0xf000035,*(lua_Number *)tlen);
      }
    }
    pGVar5 = lj_str_new(L,*(char **)(uVar1 + 0xd8),
                        (ulong)(uint)((int)sb_00->w - (int)*(undefined8 *)(uVar1 + 0xd8)));
    pcVar3->u64 = (ulong)pGVar5 | 0xfffd800000000000;
    _fromc = pcVar3;
    if (mo._4_4_ < 1) {
      if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
        if (left >= 0) {
          L->top = L->base + (int)(uint)*(byte *)(*(long *)((L->base[-2].u64 & 0x7fffffffffff) +
                                                           0x20) + -0x5d);
        }
        lj_gc_step(L);
      }
      return (TValue *)0x0;
    }
  }
  lj_err_msg(L,LJ_ERR_STROV);
}

Assistant:

TValue *lj_meta_cat(lua_State *L, TValue *top, int left)
{
  int fromc = 0;
  if (left < 0) { left = -left; fromc = 1; }
  do {
    if (!(tvisstr(top) || tvisnumber(top) || tvisbuf(top)) ||
	!(tvisstr(top-1) || tvisnumber(top-1) || tvisbuf(top-1))) {
      cTValue *mo = lj_meta_lookup(L, top-1, MM_concat);
      if (tvisnil(mo)) {
	mo = lj_meta_lookup(L, top, MM_concat);
	if (tvisnil(mo)) {
	  if (tvisstr(top-1) || tvisnumber(top-1)) top++;
	  lj_err_optype(L, top-1, LJ_ERR_OPCAT);
	  return NULL;  /* unreachable */
	}
      }
      /* One of the top two elements is not a string, call __cat metamethod:
      **
      ** before:    [...][CAT stack .........................]
      **                                 top-1     top         top+1 top+2
      ** pick two:  [...][CAT stack ...] [o1]      [o2]
      ** setup mm:  [...][CAT stack ...] [cont|?]  [mo|tmtype] [o1]  [o2]
      ** in asm:    [...][CAT stack ...] [cont|PC] [mo|delta]  [o1]  [o2]
      **            ^-- func base                              ^-- mm base
      ** after mm:  [...][CAT stack ...] <--push-- [result]
      ** next step: [...][CAT stack .............]
      */
      copyTV(L, top+2*LJ_FR2+2, top);  /* Carefully ordered stack copies! */
      copyTV(L, top+2*LJ_FR2+1, top-1);
      copyTV(L, top+LJ_FR2, mo);
      setcont(top-1, lj_cont_cat);
      if (LJ_FR2) { setnilV(top); setnilV(top+2); top += 2; }
      return top+1;  /* Trigger metamethod call. */
    } else {
      /* Pick as many strings as possible from the top and concatenate them:
      **
      ** before:    [...][CAT stack ...........................]
      ** pick str:  [...][CAT stack ...] [...... strings ......]
      ** concat:    [...][CAT stack ...] [result]
      ** next step: [...][CAT stack ............]
      */
      TValue *e, *o = top;
      uint64_t tlen = tvisstr(o) ? strV(o)->len :
		      tvisbuf(o) ? sbufxlen(bufV(o)) : STRFMT_MAXBUF_NUM;
      SBuf *sb;
      do {
	o--; tlen += tvisstr(o) ? strV(o)->len :
		     tvisbuf(o) ? sbufxlen(bufV(o)) : STRFMT_MAXBUF_NUM;
      } while (--left > 0 && (tvisstr(o-1) || tvisnumber(o-1)));
      if (tlen >= LJ_MAX_STR) lj_err_msg(L, LJ_ERR_STROV);
      sb = lj_buf_tmp_(L);
      lj_buf_more(sb, (MSize)tlen);
      for (e = top, top = o; o <= e; o++) {
	if (tvisstr(o)) {
	  GCstr *s = strV(o);
	  MSize len = s->len;
	  lj_buf_putmem(sb, strdata(s), len);
	} else if (tvisbuf(o)) {
	  SBufExt *sbx = bufV(o);
	  lj_buf_putmem(sb, sbx->r, sbufxlen(sbx));
	} else if (tvisint(o)) {
	  lj_strfmt_putint(sb, intV(o));
	} else {
	  lj_strfmt_putfnum(sb, STRFMT_G14, numV(o));
	}
      }
      setstrV(L, top, lj_buf_str(L, sb));
    }
  } while (left >= 1);
  if (LJ_UNLIKELY(G(L)->gc.total >= G(L)->gc.threshold)) {
    if (!fromc) L->top = curr_topL(L);
    lj_gc_step(L);
  }
  return NULL;
}